

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O0

void Gia_ObjAddFanout(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanout)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *local_60;
  int nFansAlloc;
  int *pNext;
  int *pPrev;
  int *pNextC;
  int *pPrevC;
  int *pFirst;
  int iFan;
  Gia_Obj_t *pFanout_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0x77,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_IsComplement(pObj);
  if (iVar1 != 0) {
LAB_009145e1:
    __assert_fail("!Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0x78,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_IsComplement(pFanout);
  if (iVar1 != 0) goto LAB_009145e1;
  iVar1 = Gia_ObjId(p,pFanout);
  if (iVar1 < 1) {
    __assert_fail("Gia_ObjId(p, pFanout) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0x79,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_ObjId(p,pObj);
  if (iVar1 < p->nFansAlloc) {
    iVar1 = Gia_ObjId(p,pFanout);
    if (iVar1 < p->nFansAlloc) goto LAB_0091472d;
  }
  iVar1 = Gia_ObjId(p,pObj);
  iVar2 = Gia_ObjId(p,pFanout);
  iVar1 = Abc_MaxInt(iVar1,iVar2);
  if (p->pFanData == (int *)0x0) {
    local_60 = (int *)malloc((long)(iVar1 * 10) << 2);
  }
  else {
    local_60 = (int *)realloc(p->pFanData,(long)(iVar1 * 10) << 2);
  }
  p->pFanData = local_60;
  memset(p->pFanData + p->nFansAlloc * 5,0,(long)(iVar1 * 2 - p->nFansAlloc) * 0x14);
  p->nFansAlloc = iVar1 * 2;
LAB_0091472d:
  iVar1 = Gia_ObjId(p,pObj);
  if (iVar1 < p->nFansAlloc) {
    iVar1 = Gia_ObjId(p,pFanout);
    if (iVar1 < p->nFansAlloc) {
      iVar1 = Gia_ObjId(p,pFanout);
      iVar2 = Gia_ObjWhatFanin(p,pFanout,pObj);
      iVar1 = Gia_FanoutCreate(iVar1,iVar2);
      piVar3 = Gia_FanoutPrev(p->pFanData,iVar1);
      piVar4 = Gia_FanoutNext(p->pFanData,iVar1);
      piVar5 = p->pFanData;
      iVar2 = Gia_ObjId(p,pObj);
      piVar5 = Gia_FanoutObj(piVar5,iVar2);
      if (*piVar5 == 0) {
        *piVar5 = iVar1;
        *piVar3 = iVar1;
        *piVar4 = iVar1;
      }
      else {
        piVar6 = Gia_FanoutPrev(p->pFanData,*piVar5);
        piVar7 = Gia_FanoutNext(p->pFanData,*piVar6);
        if (*piVar7 != *piVar5) {
          __assert_fail("*pNext == *pFirst",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                        ,0x90,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
        }
        *piVar3 = *piVar6;
        *piVar4 = *piVar5;
        *piVar6 = iVar1;
        *piVar7 = iVar1;
      }
      return;
    }
  }
  __assert_fail("Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                ,0x81,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ObjAddFanout( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData );
    assert( !Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout) );
    assert( Gia_ObjId(p, pFanout) > 0 );
    if ( Gia_ObjId(p, pObj) >= p->nFansAlloc || Gia_ObjId(p, pFanout) >= p->nFansAlloc )
    {
        int nFansAlloc = 2 * Abc_MaxInt( Gia_ObjId(p, pObj), Gia_ObjId(p, pFanout) ); 
        p->pFanData = ABC_REALLOC( int, p->pFanData, 5 * nFansAlloc );
        memset( p->pFanData + 5 * p->nFansAlloc, 0, sizeof(int) * 5 * (nFansAlloc - p->nFansAlloc) );
        p->nFansAlloc = nFansAlloc;
    }
    assert( Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc );
    iFan   = Gia_FanoutCreate( Gia_ObjId(p, pFanout), Gia_ObjWhatFanin(p, pFanout, pObj) );
    pPrevC = Gia_FanoutPrev( p->pFanData, iFan );
    pNextC = Gia_FanoutNext( p->pFanData, iFan );
    pFirst = Gia_FanoutObj( p->pFanData, Gia_ObjId(p, pObj) );
    if ( *pFirst == 0 )
    {
        *pFirst = iFan;
        *pPrevC = iFan;
        *pNextC = iFan;
    }
    else
    {
        pPrev = Gia_FanoutPrev( p->pFanData, *pFirst );
        pNext = Gia_FanoutNext( p->pFanData, *pPrev );
        assert( *pNext == *pFirst );
        *pPrevC = *pPrev;
        *pNextC = *pFirst;
        *pPrev  = iFan;
        *pNext  = iFan;
    }
}